

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
               (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                e)

{
  int iVar1;
  char *message;
  size_t seed;
  ExprBase local_50;
  AssertHelper local_48;
  iterator i;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  size_t hash;
  
  seed = (long)*(int *)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                       impl_ + 0x9e3779b9;
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  for (i.ptr_ = (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                super_ExprBase.impl_ + 8); hash = seed,
      i.ptr_ != (Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                super_ExprBase.impl_ + (long)iVar1 * 8 + 8); i.ptr_ = i.ptr_ + 1) {
    local_50.impl_ =
         (Impl *)mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                 operator*(&i);
    seed = mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                     (seed,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&local_50);
  }
  local_50.impl_ =
       (Impl *)std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                         ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_48,
                          (Expr)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                super_ExprBase.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&i,"hash","ExprHash()(e)",&hash,(unsigned_long *)&local_50);
  if ((char)i.ptr_ == '\0') {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x41f
               ,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_38);
  return;
}

Assistant:

void CheckHash(ExprType e) {
  size_t hash = HashCombine<int>(0, e.kind());
  for (typename ExprType::iterator i = e.begin(), end = e.end(); i != end; ++i)
    hash = HashCombine<Expr>(hash, *i);
  EXPECT_EQ(hash, ExprHash()(e));
}